

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_struct::dump(statement_struct *this,ostream *o)

{
  bool bVar1;
  ostream *poVar2;
  ostream *in_RSI;
  _Self *in_RDI;
  statement_base **ptr;
  const_iterator __end1;
  const_iterator __begin1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  *in_stack_ffffffffffffff90;
  ostream *in_stack_ffffffffffffffa8;
  iterator in_stack_ffffffffffffffb0;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  local_48;
  _Self *local_28;
  tree_node *local_20;
  iterator local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  poVar2 = std::operator<<(in_RSI,"< BeginStruct: ID = \"");
  poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 1));
  std::operator<<(poVar2,"\"");
  local_18 = tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_RDI);
  bVar1 = tree_type<cs::token_base_*>::iterator::usable(&local_18);
  if (bVar1) {
    std::operator<<(local_10,", Parent = ");
    local_20 = (tree_node *)tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_RDI)
    ;
    compiler_type::dump_expr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  std::operator<<(local_10," >\n");
  local_28 = in_RDI + 7;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_RDI);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)in_RDI);
  while (bVar1 = std::operator!=(in_stack_ffffffffffffff90,in_RDI), bVar1) {
    in_stack_ffffffffffffff90 =
         (_Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
          *)std::
            _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
            ::operator*(&local_48);
    (*((statement_base *)in_stack_ffffffffffffff90->_M_cur)->_vptr_statement_base[5])
              ((statement_base *)in_stack_ffffffffffffff90->_M_cur,local_10);
    std::
    _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
    ::operator++(in_stack_ffffffffffffff90);
  }
  std::operator<<(local_10,"< EndStruct >\n");
  return;
}

Assistant:

void statement_struct::dump(std::ostream &o) const
	{
		o << "< BeginStruct: ID = \"" << mName << "\"";
		if (mParent.root().usable()) {
			o << ", Parent = ";
			compiler_type::dump_expr(mParent.root(), o);
		}
		o << " >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndStruct >\n";
	}